

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O1

int AF_AActor_A_RaiseChildren
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  AActor *pAVar1;
  PClass *pPVar2;
  int iVar3;
  undefined4 extraout_var;
  PClass *pPVar4;
  AActor *thing;
  AActor *pAVar5;
  char *pcVar6;
  AActor *raiser;
  bool bVar7;
  TThinkerIterator<AActor> it;
  FThinkerIterator local_40;
  
  pPVar2 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar6 = "(paramnum) < numparam";
  }
  else {
    if (((param->field_0).field_3.Type == '\x03') &&
       (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
      pAVar1 = (AActor *)(param->field_0).field_1.a;
      if (pAVar1 != (AActor *)0x0) {
        if ((pAVar1->super_DThinker).super_DObject.Class == (PClass *)0x0) {
          iVar3 = (**(pAVar1->super_DThinker).super_DObject._vptr_DObject)(pAVar1);
          (pAVar1->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar3);
        }
        pPVar4 = (pAVar1->super_DThinker).super_DObject.Class;
        bVar7 = pPVar4 != (PClass *)0x0;
        if (pPVar4 != pPVar2 && bVar7) {
          do {
            pPVar4 = pPVar4->ParentClass;
            bVar7 = pPVar4 != (PClass *)0x0;
            if (pPVar4 == pPVar2) break;
          } while (pPVar4 != (PClass *)0x0);
        }
        if (!bVar7) {
          pcVar6 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_003d8314;
        }
      }
      if (numparam == 1) {
        param = defaultparam->Array;
        if (param[1].field_0.field_3.Type == '\0') {
LAB_003d826f:
          iVar3 = param[1].field_0.i;
          FThinkerIterator::FThinkerIterator(&local_40,AActor::RegistrationInfo.MyClass,0x80);
          thing = (AActor *)FThinkerIterator::Next(&local_40,false);
          if (thing != (AActor *)0x0) {
            raiser = pAVar1;
            if (iVar3 == 0) {
              raiser = (AActor *)0x0;
            }
            do {
              pAVar5 = (thing->master).field_0.p;
              if ((pAVar5 != (AActor *)0x0) &&
                 (((pAVar5->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
                (thing->master).field_0.p = (AActor *)0x0;
                pAVar5 = (AActor *)0x0;
              }
              if (pAVar5 == pAVar1) {
                P_Thing_Raise(thing,raiser);
              }
              thing = (AActor *)FThinkerIterator::Next(&local_40,false);
            } while (thing != (AActor *)0x0);
          }
          return 0;
        }
        pcVar6 = "(defaultparam[paramnum]).Type == REGT_INT";
      }
      else {
        if (param[1].field_0.field_3.Type == '\0') goto LAB_003d826f;
        pcVar6 = "(param[paramnum]).Type == REGT_INT";
      }
      __assert_fail(pcVar6,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1208,
                    "int AF_AActor_A_RaiseChildren(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    pcVar6 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_003d8314:
  __assert_fail(pcVar6,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0x1207,
                "int AF_AActor_A_RaiseChildren(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
  ;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_RaiseChildren)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_BOOL_DEF(copy);

	TThinkerIterator<AActor> it;
	AActor *mo;

	while ((mo = it.Next()) != NULL)
	{
		if (mo->master == self)
		{
			P_Thing_Raise(mo, copy ? self : NULL);
		}
	}
	return 0;
}